

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreePutData(BtCursor *pCsr,u32 offset,u32 amt,void *z)

{
  BtCursor *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  byte *in_RDI;
  int rc;
  int in_stack_0000004c;
  uchar *in_stack_00000050;
  u32 in_stack_00000058;
  u32 in_stack_0000005c;
  BtCursor *in_stack_00000060;
  int local_4;
  
  if (*in_RDI < 3) {
    local_4 = 0;
  }
  else {
    local_4 = btreeRestoreCursorPosition(in_RCX);
  }
  if (local_4 == 0) {
    if (*in_RDI == 0) {
      saveAllCursors((BtShared *)CONCAT44(in_ESI,in_EDX),(Pgno)((ulong)in_RCX >> 0x20),
                     (BtCursor *)0x0);
      if ((in_RDI[1] & 1) == 0) {
        local_4 = 8;
      }
      else {
        local_4 = accessPayload(in_stack_00000060,in_stack_0000005c,in_stack_00000058,
                                in_stack_00000050,in_stack_0000004c);
      }
    }
    else {
      local_4 = 4;
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePutData(BtCursor *pCsr, u32 offset, u32 amt, void *z){
  int rc;
  assert( cursorOwnsBtShared(pCsr) );
  assert( sqlite3_mutex_held(pCsr->pBtree->db->mutex) );
  assert( pCsr->curFlags & BTCF_Incrblob );

  rc = restoreCursorPosition(pCsr);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  assert( pCsr->eState!=CURSOR_REQUIRESEEK );
  if( pCsr->eState!=CURSOR_VALID ){
    return SQLITE_ABORT;
  }

  /* Save the positions of all other cursors open on this table. This is
  ** required in case any of them are holding references to an xFetch
  ** version of the b-tree page modified by the accessPayload call below.
  **
  ** Note that pCsr must be open on a INTKEY table and saveCursorPosition()
  ** and hence saveAllCursors() cannot fail on a BTREE_INTKEY table, hence
  ** saveAllCursors can only return SQLITE_OK.
  */
  VVA_ONLY(rc =) saveAllCursors(pCsr->pBt, pCsr->pgnoRoot, pCsr);
  assert( rc==SQLITE_OK );

  /* Check some assumptions:
  **   (a) the cursor is open for writing,
  **   (b) there is a read/write transaction open,
  **   (c) the connection holds a write-lock on the table (if required),
  **   (d) there are no conflicting read-locks, and
  **   (e) the cursor points at a valid row of an intKey table.
  */
  if( (pCsr->curFlags & BTCF_WriteFlag)==0 ){
    return SQLITE_READONLY;
  }
  assert( (pCsr->pBt->btsFlags & BTS_READ_ONLY)==0
              && pCsr->pBt->inTransaction==TRANS_WRITE );
  assert( hasSharedCacheTableLock(pCsr->pBtree, pCsr->pgnoRoot, 0, 2) );
  assert( !hasReadConflicts(pCsr->pBtree, pCsr->pgnoRoot) );
  assert( pCsr->pPage->intKey );

  return accessPayload(pCsr, offset, amt, (unsigned char *)z, 1);
}